

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O3

int SimpleTimingDoRender(void)

{
  double dVar1;
  int *piVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  undefined1 auVar6 [12];
  IceTInt IVar7;
  int *piVar8;
  IceTInt *process_ranks;
  IceTUByte *color_buffer;
  void *recvbuf;
  long lVar9;
  char cVar10;
  char cVar11;
  int iVar12;
  IceTInt IVar13;
  char cVar14;
  float *pfVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  IceTDouble *pIVar19;
  IceTImage IVar20;
  double *sendbuf;
  long lVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  uint uVar25;
  ulong uVar26;
  char *pcVar27;
  IceTSizeType idx;
  int iVar28;
  long lVar29;
  int iVar30;
  char cVar31;
  float fVar32;
  double dVar33;
  IceTDouble IVar34;
  undefined1 auVar35 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  IceTInt num_proc;
  IceTInt rank;
  IceTFloat background_color [4];
  int plane_orientations [3];
  IceTDouble transformed_plane [4];
  IceTInt my_position;
  IceTDouble projection_matrix [16];
  IceTDouble modelview_matrix [16];
  IceTDouble inverse_transpose_transform [16];
  int local_398;
  uint local_394;
  char *local_390;
  int *local_388;
  IceTImage local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  int *local_338;
  int local_32c;
  int *local_328;
  double local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint auStack_304 [3];
  IceTDouble local_2f8 [7];
  double local_2c0;
  uint local_2b8 [64];
  IceTDouble local_1b8 [16];
  IceTDouble local_138 [16];
  IceTDouble local_b8 [17];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined2 uVar38;
  
  local_350 = (double)CONCAT44(local_350._4_4_,SCREEN_WIDTH * g_num_tiles_x);
  local_358 = (double)CONCAT44(local_358._4_4_,(float)(SCREEN_HEIGHT * g_num_tiles_y));
  pIVar19 = g_opacity_lookup;
  lVar29 = 0;
  do {
    dVar33 = pow(2.718281828459045,(double)(int)lVar29 * -0.0009765625);
    *pIVar19 = (IceTDouble)(1.0 - dVar33);
    lVar29 = lVar29 + 1;
    pIVar19 = pIVar19 + 1;
  } while (lVar29 != 0x1001);
  icetGetIntegerv(2,(IceTInt *)&local_394);
  icetGetIntegerv(3,&local_398);
  if (g_colored_background == '\0') {
    local_318 = 0;
    uStack_310 = 0;
  }
  else {
    local_318 = 0x3f0000003e4ccccd;
    uStack_310 = 0x3f8000003f333333;
  }
  icetDrawCallback(draw);
  if (g_transparent == '\x01') {
    icetCompositeMode(0x302);
    icetSetColorFormat(0xc002);
    icetSetDepthFormat(0xd000);
    icetEnable(0x143);
  }
  else {
    icetCompositeMode(0x301);
    icetSetColorFormat(0xc001);
    icetSetDepthFormat(0xd001);
  }
  if (g_no_interlace == '\x01') {
    icetDisable(0x145);
  }
  else {
    icetEnable(0x145);
  }
  if (g_no_collect == '\x01') {
    icetDisable(0x146);
  }
  else {
    icetEnable(0x146);
  }
  icetBoundingBoxd(-0.5,0.5,-0.5,0.5,-0.5,0.5);
  local_340 = (double)CONCAT44(local_340._4_4_,local_394);
  local_360 = -0.5;
  local_368 = 0xbf000000bf000000;
  local_370 = 0.5;
  local_378 = 0x3f0000003f000000;
  local_348 = (double)CONCAT44(local_348._4_4_,local_398);
  if (local_398 < 2) {
    local_328 = (int *)0x0;
  }
  else {
    local_328 = (int *)0x0;
    uVar26 = 0;
    iVar18 = 0;
    piVar8 = (int *)0x0;
    iVar28 = local_398;
    iVar30 = local_398;
    do {
      fVar32 = *(float *)((long)&local_368 + uVar26 * 4);
      local_390 = (char *)CONCAT44(local_390._4_4_,fVar32);
      local_380.opaque_internals._0_4_ = *(float *)((long)&local_378 + uVar26 * 4) - fVar32;
      iVar17 = (iVar30 + iVar18) / 2;
      local_388 = piVar8;
      local_338 = local_328;
      piVar8 = (int *)malloc(0x18);
      iVar12 = iVar17 - iVar18;
      fVar32 = ((float)iVar12 * local_380.opaque_internals._0_4_) / (float)iVar28 + local_390._0_4_;
      *piVar8 = (int)uVar26;
      piVar8[1] = (int)fVar32;
      piVar8[4] = 0;
      piVar8[5] = 0;
      if (local_340._0_4_ < iVar17) {
        pfVar15 = (float *)((long)&local_378 + uVar26 * 4);
        iVar12 = iVar30 - iVar17;
        iVar28 = -1;
        iVar30 = iVar17;
      }
      else {
        pfVar15 = (float *)((long)&local_368 + uVar26 * 4);
        iVar28 = 1;
        iVar18 = iVar17;
      }
      *pfVar15 = fVar32;
      piVar8[2] = iVar28;
      piVar8[3] = iVar12;
      local_328 = piVar8;
      if (local_388 != (int *)0x0) {
        *(int **)(local_388 + 4) = piVar8;
        local_328 = local_338;
      }
      uVar25 = (int)uVar26 + 1;
      if (uVar25 == 3) {
        uVar25 = 0;
      }
      uVar26 = (ulong)uVar25;
      iVar28 = iVar30 - iVar18;
    } while (1 < iVar28);
  }
  if (local_348._0_4_ < g_num_tiles_y * g_num_tiles_x) {
    printf("Not enough processes to %dx%d tiles.\n");
    iVar18 = -3;
  }
  else {
    local_388 = (int *)CONCAT44(local_388._4_4_,(float)local_350._0_4_ / local_358._0_4_);
    icetResetTiles();
    if (0 < g_num_tiles_y) {
      iVar18 = 0;
      iVar28 = 0;
      IVar7 = g_num_tiles_y;
      IVar13 = g_num_tiles_x;
      do {
        if (0 < IVar13) {
          iVar30 = 0;
          do {
            icetAddTile(SCREEN_WIDTH * iVar30,SCREEN_HEIGHT * iVar18,SCREEN_WIDTH,SCREEN_HEIGHT,
                        iVar28 + iVar30);
            iVar30 = iVar30 + 1;
          } while (iVar30 < g_num_tiles_x);
          iVar28 = iVar28 + iVar30;
          IVar7 = g_num_tiles_y;
          IVar13 = g_num_tiles_x;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < IVar7);
    }
    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);
    icetMatrixFrustum((IceTDouble)((double)local_388._0_4_ * -0.65),
                      (IceTDouble)((double)local_388._0_4_ * 0.65),-0.65,0.65,3.0,5.0,local_1b8);
    iVar18 = (int)local_394 % 10;
    if (iVar18 < 7) {
      cVar10 = (char)iVar18 + '\x01';
      cVar14 = cVar10 / '\x02';
      auVar40 = ZEXT216((ushort)(CONCAT11(cVar14,cVar10) >> 7)) & _DAT_0011c880;
      auVar41[0] = auVar40[0] + cVar10;
      auVar41[1] = auVar40[1] + cVar14;
      auVar41._2_6_ = 0;
      auVar41[8] = auVar40[8];
      auVar41[9] = auVar40[9];
      auVar41[10] = auVar40[10];
      auVar41[0xb] = auVar40[0xb];
      auVar41[0xc] = auVar40[0xc];
      auVar41[0xd] = auVar40[0xd];
      auVar41[0xe] = auVar40[0xe];
      auVar41[0xf] = auVar40[0xf];
      auVar41 = auVar41 & _DAT_0011c890;
      cVar31 = cVar10 - auVar41[0];
      cVar14 = cVar14 - auVar41[1];
      cVar11 = -auVar41[7];
      Var5 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11
                                                  (cVar11,cVar11),-auVar41[6]),-auVar41[6]),
                                                  -auVar41[5]),-auVar41[5]),-auVar41[4]),
                                               CONCAT11(-auVar41[4],cVar11)) >> 8),-auVar41[3]),
                      -auVar41[3]);
      auVar4._2_10_ = Var5;
      auVar4[1] = -auVar41[2];
      auVar4[0] = -auVar41[2];
      auVar3._2_12_ = auVar4;
      auVar3[1] = cVar14;
      auVar3[0] = cVar14;
      auVar40._0_2_ = CONCAT11(cVar31,cVar31);
      auVar40._2_14_ = auVar3;
      uVar38 = (undefined2)Var5;
      auVar37._0_12_ = auVar40._0_12_;
      auVar37._12_2_ = uVar38;
      auVar37._14_2_ = uVar38;
      auVar36._12_4_ = auVar37._12_4_;
      auVar36._0_10_ = auVar40._0_10_;
      auVar36._10_2_ = auVar4._0_2_;
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_8_ = auVar40._0_8_;
      auVar35._8_2_ = auVar4._0_2_;
      auVar6._4_8_ = auVar35._8_8_;
      auVar6._2_2_ = auVar3._0_2_;
      auVar6._0_2_ = auVar3._0_2_;
      g_color[0] = (float)((int)auVar40._0_2_ >> 8);
      g_color[1] = (float)(auVar6._0_4_ >> 0x18);
      cVar10 = ((byte)(cVar10 >> 7) >> 6) + cVar10;
      cVar11 = cVar10 >> 2;
      g_color[2] = (float)(int)(char)(cVar11 - (cVar11 - (cVar10 >> 7) & 0xfeU));
    }
    else {
      g_color[2] = 0.5;
      g_color[0] = 0.5;
      g_color[1] = 0.5;
      g_color[iVar18 - 7] = 0.0;
    }
    g_color[3] = 1.0;
    if (local_394 == 0) {
      printf("Seed = %d\n",(ulong)(uint)g_seed);
      if (1 < local_398) {
        iVar18 = 1;
        do {
          icetCommSend(&g_seed,1,0x8003,iVar18,0x21);
          iVar18 = iVar18 + 1;
        } while (iVar18 < local_398);
      }
    }
    else {
      icetCommRecv(&g_seed,1,0x8003,0,0x21);
    }
    srand(g_seed);
    lVar29 = (long)g_num_frames;
    local_388 = (int *)malloc(lVar29 * 0x50);
    if (0 < lVar29) {
      local_338 = (int *)(double)(float)local_368;
      local_340 = (double)local_368._4_4_;
      local_348 = (double)local_360;
      local_350 = (double)((float)local_378 - (float)local_368);
      local_358 = (double)(local_378._4_4_ - local_368._4_4_);
      local_320 = (double)(local_370 - local_360);
      IVar20.opaque_internals = (IceTVoid *)0x0;
      do {
        icetCommBarrier();
        local_390 = (char *)icetWallTime();
        icetMatrixIdentity(local_138);
        icetMatrixMultiplyTranslate(local_138,0.0,0.0,-4.0);
        iVar18 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar18 * 360.0) / 2147483647.0),1.0,0.0,0.0);
        iVar18 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar18 * 360.0) / 2147483647.0),0.0,1.0,0.0);
        iVar18 = rand();
        icetMatrixMultiplyRotate
                  (local_138,(IceTDouble)(((double)iVar18 * 360.0) / 2147483647.0),0.0,0.0,1.0);
        if (g_transparent == '\x01') {
          local_380.opaque_internals = IVar20.opaque_internals;
          local_32c = icetCommSize();
          icetMatrixMultiply((IceTDouble *)local_2b8,local_1b8,local_138);
          icetMatrixInverseTranspose((IceTDouble *)local_2b8,local_b8);
          lVar29 = 0;
          do {
            local_2f8[0] = 0.0;
            local_2f8[1] = 0.0;
            local_2f8[2] = 0.0;
            local_2f8[3] = 0.0;
            local_2f8[lVar29] = 1.0;
            icetMatrixVectorMultiply(local_2f8 + 4,local_b8,local_2f8);
            auStack_304[lVar29] = (uint)(local_2c0 < 0.0) * 2 - 1;
            lVar29 = lVar29 + 1;
          } while (lVar29 != 3);
          local_2b8[0] = 0;
          if (local_328 != (int *)0x0) {
            uVar25 = 0;
            piVar8 = local_328;
            do {
              if (((int)(piVar8[2] & auStack_304[*piVar8]) < 0) ||
                 (0 < (int)auStack_304[*piVar8] && 0 < piVar8[2])) {
                uVar25 = uVar25 + piVar8[3];
                local_2b8[0] = uVar25;
              }
              piVar8 = *(int **)(piVar8 + 4);
            } while (piVar8 != (int *)0x0);
          }
          process_ranks = (IceTInt *)malloc((long)local_32c << 2);
          icetCommAllgather(local_2b8,1,0x8003,process_ranks);
          icetEnable(0x142);
          icetCompositeOrder(process_ranks);
          free(process_ranks);
          IVar20.opaque_internals = local_380.opaque_internals;
        }
        icetMatrixMultiplyTranslate
                  (local_138,(IceTDouble)local_338,(IceTDouble)local_340,(IceTDouble)local_348);
        icetMatrixMultiplyScale
                  (local_138,(IceTDouble)local_350,(IceTDouble)local_358,(IceTDouble)local_320);
        icetMatrixMultiplyTranslate(local_138,0.5,0.5,0.5);
        g_first_render = 1;
        local_380 = icetDrawFrame(local_1b8,local_138,(IceTFloat *)&local_318);
        icetCommBarrier();
        IVar34 = icetWallTime();
        piVar8 = local_388;
        local_390 = (char *)((double)IVar34 - (double)local_390);
        lVar29 = (long)IVar20.opaque_internals * 0x50;
        icetGetDoublev(0xc1,(IceTDouble *)((long)local_388 + lVar29));
        icetGetDoublev(0xc2,(IceTDouble *)((long)piVar8 + lVar29 + 8));
        icetGetDoublev(0xc3,(IceTDouble *)((long)piVar8 + lVar29 + 0x10));
        icetGetDoublev(0xc4,(IceTDouble *)((long)piVar8 + lVar29 + 0x18));
        icetGetDoublev(0xc5,(IceTDouble *)((long)piVar8 + lVar29 + 0x20));
        icetGetDoublev(200,(IceTDouble *)((long)piVar8 + lVar29 + 0x28));
        icetGetDoublev(0xc6,(IceTDouble *)((long)piVar8 + lVar29 + 0x30));
        icetGetDoublev(199,(IceTDouble *)((long)piVar8 + lVar29 + 0x38));
        icetGetIntegerv(0xc9,(IceTInt *)((long)piVar8 + lVar29 + 0x40));
        *(char **)((long)piVar8 + lVar29 + 0x48) = local_390;
        if (((g_write_image == '\x01') && (IVar20.opaque_internals == (IceTVoid *)0x0)) &&
           ((int)local_394 < g_num_tiles_y * g_num_tiles_x)) {
          color_buffer = (IceTUByte *)malloc((long)(SCREEN_WIDTH * SCREEN_HEIGHT * 4));
          icetImageCopyColorub(local_380,color_buffer,0xc001);
          sprintf((char *)local_2b8,"SimpleTiming%02d.ppm",(ulong)local_394);
          write_ppm((char *)local_2b8,color_buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
          free(color_buffer);
        }
        IVar20.opaque_internals = IVar20.opaque_internals + 1;
      } while ((long)IVar20.opaque_internals < (long)g_num_frames);
    }
    recvbuf = malloc((long)local_398 * 0x50);
    local_390 = icetGetStrategyName();
    if (g_single_image_strategy == 0x7004) {
      icetGetIntegerv(0x40,(IceTInt *)local_2b8);
      pcVar27 = SimpleTimingDoRender::name_buffer;
      sprintf(SimpleTimingDoRender::name_buffer,"radix-k %d",(ulong)local_2b8[0]);
    }
    else {
      pcVar27 = icetGetSingleImageStrategyName();
    }
    icetGetIntegerv(0x41,(IceTInt *)local_2b8);
    if (0 < g_num_frames) {
      lVar29 = 0;
      do {
        sendbuf = (double *)(lVar29 * 0x50 + (long)local_388);
        icetCommGather(sendbuf,0x50,0x8001,recvbuf,0);
        if (local_394 == 0) {
          lVar21 = (long)local_398;
          dVar33 = *sendbuf;
          if (lVar21 < 1) {
            dVar39 = sendbuf[1];
            dVar43 = sendbuf[2];
            dVar44 = sendbuf[3];
            dVar45 = sendbuf[4];
            dVar46 = sendbuf[5];
            dVar47 = sendbuf[6];
            dVar48 = sendbuf[7];
            dVar49 = sendbuf[9];
            lVar9 = 0;
          }
          else {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = sendbuf[1];
            dVar43 = sendbuf[2];
            dVar44 = sendbuf[3];
            dVar45 = sendbuf[4];
            dVar46 = sendbuf[5];
            dVar47 = sendbuf[6];
            dVar48 = sendbuf[7];
            iVar18 = *(int *)(sendbuf + 8);
            dVar49 = sendbuf[9];
            lVar22 = 0;
            lVar9 = 0;
            do {
              dVar39 = *(double *)((long)recvbuf + lVar22);
              if (dVar33 < dVar39) {
                *sendbuf = dVar39;
                dVar33 = dVar39;
              }
              dVar39 = *(double *)((long)recvbuf + lVar22 + 8);
              if (auVar42._0_8_ < dVar39) {
                sendbuf[1] = dVar39;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar39;
              }
              dVar39 = auVar42._0_8_;
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x10);
              if (dVar43 < dVar1) {
                sendbuf[2] = dVar1;
                dVar43 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x18);
              if (dVar44 < dVar1) {
                sendbuf[3] = dVar1;
                dVar44 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x20);
              if (dVar45 < dVar1) {
                sendbuf[4] = dVar1;
                dVar45 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x28);
              if (dVar46 < dVar1) {
                sendbuf[5] = dVar1;
                dVar46 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x30);
              if (dVar47 < dVar1) {
                sendbuf[6] = dVar1;
                dVar47 = dVar1;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x38);
              if (dVar48 < dVar1) {
                sendbuf[7] = dVar1;
                dVar48 = dVar1;
              }
              iVar28 = *(int *)((long)recvbuf + lVar22 + 0x40);
              if (iVar18 < iVar28) {
                *(int *)(sendbuf + 8) = iVar28;
                iVar18 = iVar28;
              }
              dVar1 = *(double *)((long)recvbuf + lVar22 + 0x48);
              if (dVar49 < dVar1) {
                sendbuf[9] = dVar1;
                dVar49 = dVar1;
              }
              lVar9 = lVar9 + iVar28;
              lVar22 = lVar22 + 0x50;
            } while (lVar21 * 0x50 != lVar22);
          }
          pcVar16 = "no";
          if (g_transparent != '\0') {
            pcVar16 = "yes";
          }
          pcVar23 = "yes";
          if (g_no_interlace != '\0') {
            pcVar23 = "no";
          }
          pcVar24 = "yes";
          if (g_no_collect != '\0') {
            pcVar24 = "no";
          }
          printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n"
                 ,dVar33,dVar39,dVar43,dVar44,dVar45,dVar46,dVar47,dVar48,lVar21,local_390,pcVar27,
                 (ulong)(uint)g_num_tiles_x,(ulong)(uint)g_num_tiles_y,SCREEN_WIDTH,SCREEN_HEIGHT,
                 pcVar16,pcVar23,pcVar24,local_2b8[0],(int)lVar29,lVar9,dVar49);
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < g_num_frames);
    }
    free(recvbuf);
    piVar8 = local_328;
    while (piVar8 != (int *)0x0) {
      piVar2 = *(int **)(piVar8 + 4);
      free(piVar8);
      piVar8 = piVar2;
    }
    free(local_388);
    iVar18 = 0;
    icetCommBarrier();
  }
  return iVar18;
}

Assistant:

static int SimpleTimingDoRender()
{
    IceTInt rank;
    IceTInt num_proc;

    float aspect = (  (float)(g_num_tiles_x*SCREEN_WIDTH)
                    / (float)(g_num_tiles_y*SCREEN_HEIGHT) );
    int frame;
    float bounds_min[3];
    float bounds_max[3];
    region_divide region_divisions;

    IceTDouble projection_matrix[16];
    IceTFloat background_color[4];

    timings_type *timing_array;

    /* Normally, the first thing that you do is set up your communication and
     * then create at least one IceT context.  This has already been done in the
     * calling function (i.e. icetTests_mpi.c).  See the init_mpi_comm in
     * mpi_comm.h for an example.
     */

    init_opacity_lookup();

    /* If we had set up the communication layer ourselves, we could have gotten
     * these parameters directly from it.  Since we did not, this provides an
     * alternate way. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    if (g_colored_background) {
        background_color[0] = 0.2f;
        background_color[1] = 0.5f;
        background_color[2] = 0.7f;
        background_color[3] = 1.0f;
    } else {
        background_color[0] = 0.0f;
        background_color[1] = 0.0f;
        background_color[2] = 0.0f;
        background_color[3] = 0.0f;
    }

    /* Give IceT a function that will issue the drawing commands. */
    icetDrawCallback(draw);

    /* Other IceT state. */
    if (g_transparent) {
        icetCompositeMode(ICET_COMPOSITE_MODE_BLEND);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_FLOAT);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_NONE);
        icetEnable(ICET_CORRECT_COLORED_BACKGROUND);
    } else {
        icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_UBYTE);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_FLOAT);
    }

    if (g_no_interlace) {
        icetDisable(ICET_INTERLACE_IMAGES);
    } else {
        icetEnable(ICET_INTERLACE_IMAGES);
    }

    if (g_no_collect) {
        icetDisable(ICET_COLLECT_IMAGES);
    } else {
        icetEnable(ICET_COLLECT_IMAGES);
    }

    /* Give IceT the bounds of the polygons that will be drawn.  Note that IceT
     * will take care of any transformation that gets passed to
     * icetDrawFrame. */
    icetBoundingBoxd(-0.5f, 0.5f, -0.5, 0.5, -0.5, 0.5);

    /* Determine the region we want the local geometry to be in.  This will be
     * used for the modelview transformation later. */
    find_region(rank, num_proc, bounds_min, bounds_max, &region_divisions);

    /* Set up the tiled display.  The asignment of displays to processes is
     * arbitrary because, as this is a timing test, I am not too concerned
     * about who shows what. */
    if (g_num_tiles_x*g_num_tiles_y <= num_proc) {
        int x, y, display_rank;
        icetResetTiles();
        display_rank = 0;
        for (y = 0; y < g_num_tiles_y; y++) {
            for (x = 0; x < g_num_tiles_x; x++) {
                icetAddTile(x*(IceTInt)SCREEN_WIDTH,
                            y*(IceTInt)SCREEN_HEIGHT,
                            SCREEN_WIDTH,
                            SCREEN_HEIGHT,
                            display_rank);
                display_rank++;
            }
        }
    } else {
        printf("Not enough processes to %dx%d tiles.\n",
               g_num_tiles_x, g_num_tiles_y);
        return TEST_FAILED;
    }

    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);

    /* Set up the projection matrix. */
    icetMatrixFrustum(-0.65*aspect, 0.65*aspect, -0.65, 0.65, 3.0, 5.0,
                      projection_matrix);

    if (rank%10 < 7) {
        IceTInt color_bits = rank%10 + 1;
        g_color[0] = (float)(color_bits%2);
        g_color[1] = (float)((color_bits/2)%2);
        g_color[2] = (float)((color_bits/4)%2);
        g_color[3] = 1.0f;
    } else {
        g_color[0] = g_color[1] = g_color[2] = 0.5f;
        g_color[rank%10 - 7] = 0.0f;
        g_color[3] = 1.0f;
    }

    /* Initialize randomness. */
    if (rank == 0) {
        int i;
        printf("Seed = %d\n", g_seed);
        for (i = 1; i < num_proc; i++) {
            icetCommSend(&g_seed, 1, ICET_INT, i, 33);
        }
    } else {
        icetCommRecv(&g_seed, 1, ICET_INT, 0, 33);
    }

    srand(g_seed);

    timing_array = malloc(g_num_frames * sizeof(timings_type));

    for (frame = 0; frame < g_num_frames; frame++) {
        IceTDouble elapsed_time;
        IceTDouble modelview_matrix[16];
        IceTImage image;

        /* Get everyone to start at the same time. */
        icetCommBarrier();

        elapsed_time = icetWallTime();

        /* We can set up a modelview matrix here and IceT will factor this in
         * determining the screen projection of the geometry. */
        icetMatrixIdentity(modelview_matrix);

        /* Move geometry back so that it can be seen by the camera. */
        icetMatrixMultiplyTranslate(modelview_matrix, 0.0, 0.0, -4.0);

        /* Rotate to some random view. */
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 1.0, 0.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 1.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 0.0, 1.0);

        /* Determine view ordering of geometry based on camera position
           (represented by the current projection and modelview matrices). */
        if (g_transparent) {
            find_composite_order(projection_matrix,
                                 modelview_matrix,
                                 region_divisions);
        }

        /* Translate the unit box centered on the origin to the region specified
         * by bounds_min and bounds_max. */
        icetMatrixMultiplyTranslate(modelview_matrix,
                                    bounds_min[0],
                                    bounds_min[1],
                                    bounds_min[2]);
        icetMatrixMultiplyScale(modelview_matrix,
                                bounds_max[0] - bounds_min[0],
                                bounds_max[1] - bounds_min[1],
                                bounds_max[2] - bounds_min[2]);
        icetMatrixMultiplyTranslate(modelview_matrix, 0.5, 0.5, 0.5);

      /* Instead of calling draw() directly, call it indirectly through
       * icetDrawFrame().  IceT will automatically handle image
       * compositing. */
        g_first_render = ICET_TRUE;
        image = icetDrawFrame(projection_matrix,
                              modelview_matrix,
                              background_color);

        /* Let everyone catch up before finishing the frame. */
        icetCommBarrier();

        elapsed_time = icetWallTime() - elapsed_time;

        /* Print timings to logging. */
        icetGetDoublev(ICET_RENDER_TIME,
                       &timing_array[frame].render_time);
        icetGetDoublev(ICET_BUFFER_READ_TIME,
                       &timing_array[frame].buffer_read_time);
        icetGetDoublev(ICET_BUFFER_WRITE_TIME,
                       &timing_array[frame].buffer_write_time);
        icetGetDoublev(ICET_COMPRESS_TIME,
                       &timing_array[frame].compress_time);
        icetGetDoublev(ICET_BLEND_TIME,
                       &timing_array[frame].blend_time);
        icetGetDoublev(ICET_TOTAL_DRAW_TIME,
                       &timing_array[frame].draw_time);
        icetGetDoublev(ICET_COMPOSITE_TIME,
                       &timing_array[frame].composite_time);
        icetGetDoublev(ICET_COLLECT_TIME,
                       &timing_array[frame].collect_time);
        icetGetIntegerv(ICET_BYTES_SENT,
                        &timing_array[frame].bytes_sent);
        timing_array[frame].frame_time = elapsed_time;

        /* Write out image to verify rendering occurred correctly. */
        if (   g_write_image
            && (rank < (g_num_tiles_x*g_num_tiles_y))
            && (frame == 0)
               ) {
            IceTUByte *buffer = malloc(SCREEN_WIDTH*SCREEN_HEIGHT*4);
            char filename[256];
            icetImageCopyColorub(image, buffer, ICET_IMAGE_COLOR_RGBA_UBYTE);
            sprintf(filename, "SimpleTiming%02d.ppm", rank);
            write_ppm(filename, buffer, (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
            free(buffer);
        }
    }

    /* Print logging header. */
    {
        timings_type *timing_collection = malloc(num_proc*sizeof(timings_type));
        const char *strategy_name;
        const char *si_strategy_name;
        IceTInt max_image_split;

        strategy_name = icetGetStrategyName();
        if (g_single_image_strategy == ICET_SINGLE_IMAGE_STRATEGY_RADIXK) {
            static char name_buffer[256];
            IceTInt magic_k;

            icetGetIntegerv(ICET_MAGIC_K, &magic_k);
            sprintf(name_buffer, "radix-k %d", (int)magic_k);
            si_strategy_name = name_buffer;
        } else {
            si_strategy_name = icetGetSingleImageStrategyName();
        }

        icetGetIntegerv(ICET_MAX_IMAGE_SPLIT, &max_image_split);

        for (frame = 0; frame < g_num_frames; frame++) {
            timings_type *timing = &timing_array[frame];

            icetCommGather(timing,
                           sizeof(timings_type),
                           ICET_BYTE,
                           timing_collection,
                           0);

            if (rank == 0) {
                int p;
                IceTInt64 total_bytes_sent = 0;

                for (p = 0; p < num_proc; p++) {
#define UPDATE_MAX(field) if (timing->field < timing_collection[p].field) timing->field = timing_collection[p].field;
                    UPDATE_MAX(render_time);
                    UPDATE_MAX(buffer_read_time);
                    UPDATE_MAX(buffer_write_time);
                    UPDATE_MAX(compress_time);
                    UPDATE_MAX(blend_time);
                    UPDATE_MAX(draw_time);
                    UPDATE_MAX(composite_time);
                    UPDATE_MAX(collect_time);
                    UPDATE_MAX(bytes_sent);
                    UPDATE_MAX(frame_time);
                    total_bytes_sent += timing_collection[p].bytes_sent;
                }

                printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
                       num_proc,
                       strategy_name,
                       si_strategy_name,
                       g_num_tiles_x,
                       g_num_tiles_y,
                       SCREEN_WIDTH,
                       SCREEN_HEIGHT,
                       g_transparent ? "yes" : "no",
                       g_no_interlace ? "no" : "yes",
                       g_no_collect ? "no" : "yes",
                       max_image_split,
                       frame,
                       timing->render_time,
                       timing->buffer_read_time,
                       timing->buffer_write_time,
                       timing->compress_time,
                       timing->blend_time,
                       timing->draw_time,
                       timing->composite_time,
                       timing->collect_time,
                       (long int)total_bytes_sent,
                       timing->frame_time);
            }
        }

        free(timing_collection);
    }

    free_region_divide(region_divisions);
    free(timing_array);

    /* This is to prevent a non-root from printing while the root is writing
       the log. */
    icetCommBarrier();

    return TEST_PASSED;
}